

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

Vector3<double> *
s2pred::GetCircumcenter<double>
          (Vector3<double> *__return_storage_ptr__,Vector3<double> *a,Vector3<double> *b,
          Vector3<double> *c,double *error)

{
  FloatType FVar1;
  FloatType FVar2;
  FloatType FVar3;
  __type_conflict _Var4;
  __type_conflict _Var5;
  double dVar6;
  undefined1 local_110 [8];
  Vector3<double> mbc;
  Vector3<double> mab;
  double bc_len;
  double nbc_len;
  Vector3<double> nbc;
  double ab_len;
  double nab_len;
  Vector3<double> nab;
  Vector3<double> bc_sum;
  Vector3<double> bc_diff;
  Vector3<double> ab_sum;
  Vector3<double> ab_diff;
  double T_ERR;
  double *error_local;
  Vector3<double> *c_local;
  Vector3<double> *b_local;
  Vector3<double> *a_local;
  
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)(ab_sum.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)a,b);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            ((D *)(bc_diff.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)a,b);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)(bc_sum.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)b,c);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            ((D *)(nab.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)b,c);
  Vector3<double>::CrossProd
            ((Vector3<double> *)&nab_len,(Vector3<double> *)(ab_sum.c_ + 2),
             (Vector3<double> *)(bc_diff.c_ + 2));
  FVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&nab_len);
  nbc.c_[2] = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                        ((BasicVector<Vector3,_double,_3UL> *)(ab_sum.c_ + 2));
  Vector3<double>::CrossProd
            ((Vector3<double> *)&nbc_len,(Vector3<double> *)(bc_sum.c_ + 2),
             (Vector3<double> *)(nab.c_ + 2));
  FVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&nbc_len);
  FVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)(bc_sum.c_ + 2));
  Vector3<double>::CrossProd
            ((Vector3<double> *)(mbc.c_ + 2),(Vector3<double> *)&nab_len,
             (Vector3<double> *)(bc_diff.c_ + 2));
  Vector3<double>::CrossProd
            ((Vector3<double> *)local_110,(Vector3<double> *)&nbc_len,
             (Vector3<double> *)(nab.c_ + 2));
  _Var4 = std::sqrt<int>(3);
  dVar6 = nbc.c_[2] + FVar3;
  _Var5 = std::sqrt<int>(3);
  *error = ((_Var4 * 24.0 + 16.0) * 1.1102230246251565e-16 + dVar6 * 8.881784197001252e-16) * FVar1
           * FVar2 + _Var5 * 128.0 * 1.1102230246251565e-16 * 1.1102230246251565e-16 *
                     (FVar1 + FVar2) + 1.8669045833583425e-60;
  Vector3<double>::CrossProd
            (__return_storage_ptr__,(Vector3<double> *)(mbc.c_ + 2),(Vector3<double> *)local_110);
  return __return_storage_ptr__;
}

Assistant:

Vector3<T> GetCircumcenter(const Vector3<T>& a, const Vector3<T>& b,
                           const Vector3<T>& c, T* error) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // We compute the circumcenter using the intersection of the perpendicular
  // bisectors of AB and BC.  The formula is essentially
  //
  //    Z = ((A x B) x (A + B)) x ((B x C) x (B + C)),
  //
  // except that we compute the cross product (A x B) as (A - B) x (A + B)
  // (and similarly for B x C) since this is much more stable when the inputs
  // are unit vectors.
  Vector3<T> ab_diff = a - b, ab_sum = a + b;
  Vector3<T> bc_diff = b - c, bc_sum = b + c;
  Vector3<T> nab = ab_diff.CrossProd(ab_sum);
  T nab_len = nab.Norm();
  T ab_len = ab_diff.Norm();
  Vector3<T> nbc = bc_diff.CrossProd(bc_sum);
  T nbc_len = nbc.Norm();
  T bc_len = bc_diff.Norm();
  Vector3<T> mab = nab.CrossProd(ab_sum);
  Vector3<T> mbc = nbc.CrossProd(bc_sum);
  *error = (((16 + 24 * sqrt(3)) * T_ERR +
                8 * DBL_ERR * (ab_len + bc_len)) * nab_len * nbc_len +
               128 * sqrt(3) * DBL_ERR * T_ERR * (nab_len + nbc_len) +
               3 * 4096 * DBL_ERR * DBL_ERR * T_ERR * T_ERR);
  return mab.CrossProd(mbc);
}